

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O3

void __thiscall
F2DDrawer::AddPoly(F2DDrawer *this,FTexture *texture,FVector2 *points,int npoints,double originx,
                  double originy,double scalex,double scaley,DAngle *rotation,
                  FDynamicColormap *colormap,int lightlevel)

{
  uchar *puVar1;
  double dVar2;
  FVector2 FVar3;
  uint uVar4;
  FSimpleVertex *pFVar5;
  uchar *puVar6;
  uint uVar7;
  FMaterial *pFVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  double local_40;
  double local_38;
  
  pFVar8 = FMaterial::ValidateTexture(texture,false);
  if (pFVar8 != (FMaterial *)0x0) {
    TArray<FSimpleVertex,_FSimpleVertex>::Grow(&this->mVertices,npoints);
    uVar4 = (this->mVertices).Count;
    (this->mVertices).Count = uVar4 + npoints;
    if (0 < npoints) {
      dVar2 = rotation->Degrees;
      uVar7 = (uint)((double)((uint)texture->Height * 2) / (texture->Scale).Y);
      fVar11 = (float)(1.0 / ((double)(int)((uVar7 & 1) + ((int)uVar7 >> 1)) * scaley));
      if ((texture->field_0x31 & 0x20) != 0) {
        fVar11 = -fVar11;
      }
      uVar7 = (uint)((double)((uint)texture->Width * 2) / (texture->Scale).X);
      sincos(dVar2 * 0.017453292519943295,&local_38,&local_40);
      lVar9 = (long)(int)uVar4 * 0x18;
      uVar10 = 0;
      do {
        FVar3 = points[uVar10];
        fVar12 = (-0.5 - (float)originx) + FVar3.X;
        fVar14 = (-0.5 - (float)originy) + FVar3.Y;
        if (dVar2 != 0.0) {
          fVar13 = fVar12 * (float)local_38;
          fVar12 = fVar12 * (float)local_40 - fVar14 * (float)local_38;
          fVar14 = fVar13 + fVar14 * (float)local_40;
        }
        pFVar5 = (this->mVertices).Array;
        *(FVector2 *)((long)&pFVar5->x + lVar9) = FVar3;
        *(undefined4 *)((long)&pFVar5->y + lVar9) = 0;
        *(ulong *)((long)&pFVar5->u + lVar9) =
             CONCAT44(fVar14 * fVar11,
                      fVar12 * (float)(1.0 / ((double)(int)((uVar7 & 1) + ((int)uVar7 >> 1)) *
                                             scalex)));
        *(undefined4 *)((long)&(pFVar5->color).field_0 + lVar9) = 0xffffffff;
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x18;
      } while ((uint)npoints != uVar10);
    }
    TArray<unsigned_char,_unsigned_char>::Grow(&this->mData,0x28);
    uVar7 = (this->mData).Count;
    (this->mData).Count = uVar7 + 0x28;
    puVar6 = (this->mData).Array;
    puVar1 = puVar6 + (int)uVar7;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '(';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    *(uint *)(puVar6 + (long)(int)uVar7 + 8) = uVar4;
    *(int *)(puVar6 + (long)(int)uVar7 + 0xc) = npoints;
    *(FMaterial **)(puVar6 + (long)(int)uVar7 + 0x10) = pFVar8;
    *(int *)(puVar6 + (long)(int)uVar7 + 0x18) = lightlevel;
    *(FDynamicColormap **)(puVar6 + (long)(int)uVar7 + 0x20) = colormap;
    this->mLastLineCmd = -1;
  }
  return;
}

Assistant:

void F2DDrawer::AddPoly(FTexture *texture, FVector2 *points, int npoints,
		double originx, double originy, double scalex, double scaley,
		DAngle rotation, FDynamicColormap *colormap, int lightlevel)
{
	FMaterial *gltexture = FMaterial::ValidateTexture(texture, false);

	if (gltexture == nullptr)
	{
		return;
	}
	DataSimplePoly poly;

	poly.mType = DrawTypePoly;
	poly.mLen = (sizeof(poly) + 7) & ~7;
	poly.mTexture = gltexture;
	poly.mColormap = colormap;
	poly.mLightLevel = lightlevel;
	poly.mVertCount = npoints;
	poly.mVertIndex = (int)mVertices.Reserve(npoints);

	bool dorotate = rotation != 0;

	float cosrot = cos(rotation.Radians());
	float sinrot = sin(rotation.Radians());

	float uscale = float(1.f / (texture->GetScaledWidth() * scalex));
	float vscale = float(1.f / (texture->GetScaledHeight() * scaley));
	if (texture->bHasCanvas)
	{
		vscale = 0 - vscale;
	}
	float ox = float(originx);
	float oy = float(originy);

	for (int i = 0; i < npoints; ++i)
	{
		float u = points[i].X - 0.5f - ox;
		float v = points[i].Y - 0.5f - oy;
		if (dorotate)
		{
			float t = u;
			u = t * cosrot - v * sinrot;
			v = v * cosrot + t * sinrot;
		}
		mVertices[poly.mVertIndex+i].Set(points[i].X, points[i].Y, 0, u*uscale, v*vscale);
	}
	AddData(&poly);
}